

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  byte *pbVar1;
  size_t *len_local;
  uchar *end_local;
  uchar **p_local;
  
  if ((long)end - (long)*p < 1) {
    return -0x60;
  }
  if ((**p & 0x80) == 0) {
    pbVar1 = *p;
    *p = pbVar1 + 1;
    *len = (ulong)*pbVar1;
  }
  else {
    switch(**p & 0x7f) {
    case 1:
      if ((long)end - (long)*p < 2) {
        return -0x60;
      }
      *len = (ulong)(*p)[1];
      *p = *p + 2;
      break;
    case 2:
      if ((long)end - (long)*p < 3) {
        return -0x60;
      }
      *len = (ulong)CONCAT11((*p)[1],(*p)[2]);
      *p = *p + 3;
      break;
    case 3:
      if ((long)end - (long)*p < 4) {
        return -0x60;
      }
      *len = (ulong)(*p)[1] << 0x10 | (ulong)(*p)[2] << 8 | (ulong)(*p)[3];
      *p = *p + 4;
      break;
    case 4:
      if ((long)end - (long)*p < 5) {
        return -0x60;
      }
      *len = (ulong)(*p)[1] << 0x18 | (ulong)(*p)[2] << 0x10 | (ulong)(*p)[3] << 8 | (ulong)(*p)[4];
      *p = *p + 5;
      break;
    default:
      return -100;
    }
  }
  if ((ulong)((long)end - (long)*p) < *len) {
    p_local._4_4_ = -0x60;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_len( unsigned char **p,
                  const unsigned char *end,
                  size_t *len )
{
    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( ( **p & 0x80 ) == 0 )
        *len = *(*p)++;
    else
    {
        switch( **p & 0x7F )
        {
        case 1:
            if( ( end - *p ) < 2 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = (*p)[1];
            (*p) += 2;
            break;

        case 2:
            if( ( end - *p ) < 3 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 8 ) | (*p)[2];
            (*p) += 3;
            break;

        case 3:
            if( ( end - *p ) < 4 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 16 ) |
                   ( (size_t)(*p)[2] << 8  ) | (*p)[3];
            (*p) += 4;
            break;

        case 4:
            if( ( end - *p ) < 5 )
                return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

            *len = ( (size_t)(*p)[1] << 24 ) | ( (size_t)(*p)[2] << 16 ) |
                   ( (size_t)(*p)[3] << 8  ) |           (*p)[4];
            (*p) += 5;
            break;

        default:
            return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
        }
    }

    if( *len > (size_t) ( end - *p ) )
        return( MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    return( 0 );
}